

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImVector<ImGuiViewportP_*> *pIVar1;
  ImGuiNavMoveResult *pIVar2;
  ImGuiNextWindowData *pIVar3;
  int *piVar4;
  ImVector<ImGuiContextHook> *this;
  ImVector<float> *this_00;
  ImVec2 *pIVar5;
  ImVec2 *pIVar6;
  ImVec2 IVar7;
  byte bVar8;
  ImFontAtlas *pIVar9;
  char *pcVar10;
  ImGuiViewportP *pIVar11;
  ImVec4 IVar12;
  ImVec4 IVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  byte bVar24;
  ImGuiContext *pIVar25;
  ImGuiContext *pIVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  int n;
  uint uVar31;
  ImGuiID IVar32;
  ImGuiKeyModFlags IVar33;
  ImGuiInputSource IVar34;
  ImGuiContextHook *pIVar35;
  ImFont **ppIVar36;
  long lVar37;
  ImGuiViewportP **ppIVar38;
  ImFont *font;
  ImGuiWindow *pIVar39;
  ImGuiPopupData *pIVar40;
  ImGuiWindow **ppIVar41;
  float *pfVar42;
  ImGuiTable *table;
  ImRect *pIVar43;
  int i;
  ImGuiID IVar44;
  ImGuiWindow *window;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar45;
  long lVar46;
  uint uVar47;
  ImGuiWindow *old_nav_window;
  bool *pbVar48;
  ImGuiContext *pIVar49;
  int n_1;
  int iVar50;
  int iVar51;
  ImGuiNavDirSourceFlags dir_sources;
  long lVar52;
  ImGuiNavLayer IVar53;
  ImGuiNavMoveResult *pIVar54;
  float fVar55;
  float fVar57;
  float fVar58;
  undefined8 uVar59;
  ImVec2 IVar60;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar56;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  double dVar61;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined8 uVar86;
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [56];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  ImRect IVar112;
  long lStack_70;
  float local_68;
  undefined1 local_48 [8];
  ImVec2 IStack_40;
  ImGuiContext *local_38;
  undefined1 auVar87 [56];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  pIVar25 = GImGui;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xf01,"void ImGui::NewFrame()");
  }
  this = &GImGui->Hooks;
  iVar50 = (GImGui->Hooks).Size;
  while (0 < iVar50) {
    iVar50 = iVar50 + -1;
    pIVar35 = ImVector<ImGuiContextHook>::operator[](this,iVar50);
    if (*(int *)(pIVar35 + 4) == 7) {
      pIVar35 = ImVector<ImGuiContextHook>::operator[](this,iVar50);
      ImVector<ImGuiContextHook>::erase(this,pIVar35);
    }
  }
  CallContextHooks(pIVar25,ImGuiContextHookType_NewFramePre);
  pIVar49 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b8d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar50 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar50 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1b8e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar50 != 0) && (GImGui->FrameCountEnded != iVar50)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b8f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b90,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar9 = (GImGui->IO).Fonts;
  if ((pIVar9->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b91,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  ppIVar36 = ImVector<ImFont_*>::operator[](&pIVar9->Fonts,0);
  if ((*ppIVar36)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b92,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar49->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b93,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar49->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b94,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar55 = (pIVar49->Style).Alpha;
  if ((fVar55 < 0.0) || (1.0 < fVar55)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b95,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar49->Style).WindowMinSize.x < 1.0) || ((pIVar49->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b96,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (pIVar49->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b97,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar37 = 0;
  while (lVar37 != 0x16) {
    piVar4 = (pIVar49->IO).KeyMap + lVar37;
    lVar37 = lVar37 + 1;
    if (0x200 < *piVar4 + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1b99,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  if ((((pIVar49->IO).ConfigFlags & 1) != 0) && ((pIVar49->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b9d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar49->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar49->IO).BackendFlags & 2) == 0)) {
    (pIVar49->IO).ConfigWindowsResizeFromEdges = false;
  }
  pIVar49 = GImGui;
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x27b3,"void ImGui::UpdateSettings()");
    }
    pcVar10 = (GImGui->IO).IniFilename;
    if (pcVar10 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar10);
    }
    pIVar49->SettingsLoaded = true;
  }
  if ((0.0 < pIVar49->SettingsDirtyTimer) &&
     (fVar55 = pIVar49->SettingsDirtyTimer - (pIVar49->IO).DeltaTime,
     pIVar49->SettingsDirtyTimer = fVar55, fVar55 <= 0.0)) {
    pcVar10 = (pIVar49->IO).IniFilename;
    if (pcVar10 == (char *)0x0) {
      (pIVar49->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar10);
    }
    pIVar49->SettingsDirtyTimer = 0.0;
  }
  pIVar25->Time = (double)(pIVar25->IO).DeltaTime + pIVar25->Time;
  pIVar25->WithinFrameScope = true;
  pIVar25->FrameCount = pIVar25->FrameCount + 1;
  pIVar25->TooltipOverrideCount = 0;
  pIVar25->WindowsActiveCount = 0;
  iVar51 = 0;
  ImVector<unsigned_int>::resize(&pIVar25->MenusIdSubmittedThisFrame,0);
  fVar55 = (pIVar25->IO).DeltaTime;
  iVar50 = pIVar25->FramerateSecPerFrameIdx;
  pIVar25->FramerateSecPerFrameAccum =
       (fVar55 - pIVar25->FramerateSecPerFrame[iVar50]) + pIVar25->FramerateSecPerFrameAccum;
  pIVar25->FramerateSecPerFrame[iVar50] = fVar55;
  pIVar25->FramerateSecPerFrameIdx = (iVar50 + 1) % 0x78;
  auVar76 = ZEXT416((uint)(1.0 / (pIVar25->FramerateSecPerFrameAccum / 120.0)));
  auVar100 = ZEXT1664(auVar76);
  auVar63._0_12_ = ZEXT812(0);
  auVar63._12_4_ = 0;
  auVar63 = vcmpss_avx(auVar63,ZEXT416((uint)pIVar25->FramerateSecPerFrameAccum),1);
  auVar62._8_4_ = 0x7f7fffff;
  auVar62._0_8_ = 0x7f7fffff7f7fffff;
  auVar62._12_4_ = 0x7f7fffff;
  auVar63 = vblendvps_avx(auVar62,auVar76,auVar63);
  (pIVar25->IO).Framerate = auVar63._0_4_;
  pIVar49 = GImGui;
  if ((GImGui->Viewports).Size != 1) {
    __assert_fail("g.Viewports.Size == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x28e2,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar1 = &GImGui->Viewports;
  ppIVar38 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,0);
  pIVar11 = *ppIVar38;
  (pIVar11->super_ImGuiViewport).Flags = 5;
  (pIVar11->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar11->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar11->super_ImGuiViewport).Size = (pIVar49->IO).DisplaySize;
  for (; iVar51 < pIVar1->Size; iVar51 = iVar51 + 1) {
    ppIVar38 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar51);
    pIVar11 = *ppIVar38;
    pIVar11->WorkOffsetMin = pIVar11->CurrWorkOffsetMin;
    pIVar11->WorkOffsetMax = pIVar11->CurrWorkOffsetMax;
    uVar59 = SUB168(ZEXT816(0) << 0x20,0);
    uVar86 = SUB168(ZEXT816(0) << 0x20,8);
    (pIVar11->CurrWorkOffsetMin).x = (float)(int)uVar59;
    (pIVar11->CurrWorkOffsetMin).y = (float)(int)((ulong)uVar59 >> 0x20);
    (pIVar11->CurrWorkOffsetMax).x = (float)(int)uVar86;
    (pIVar11->CurrWorkOffsetMax).y = (float)(int)((ulong)uVar86 >> 0x20);
    ImGuiViewportP::UpdateWorkRect(pIVar11);
  }
  ((pIVar25->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar25->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xf24,"void ImGui::NewFrame()");
  }
  pIVar1 = &pIVar25->Viewports;
  iVar50 = 0;
  IVar13 = _DAT_001d49b0;
  while( true ) {
    auVar101 = auVar100._8_56_;
    auVar87 = ZEXT856(IVar13._8_8_);
    if (pIVar1->Size <= iVar50) break;
    ppIVar38 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar50);
    IVar112 = ImGuiViewportP::GetMainRect(*ppIVar38);
    auVar100._0_8_ = IVar112.Max;
    auVar100._8_56_ = auVar101;
    auVar82._0_8_ = IVar112.Min;
    auVar82._8_56_ = auVar87;
    auVar62 = auVar82._0_16_;
    auVar63 = vcmpps_avx(auVar62,(undefined1  [16])IVar13,1);
    auVar76 = vminps_avx(auVar62,(undefined1  [16])IVar13);
    auVar109._0_4_ = auVar76._0_4_;
    auVar109._4_12_ = IVar13._4_12_;
    auVar63 = vblendvps_avx(auVar109,auVar62,auVar63);
    IVar12 = (ImVec4)vblendps_avx(auVar109,auVar63,2);
    auVar63 = vshufpd_avx((undefined1  [16])IVar13,(undefined1  [16])IVar13,1);
    auVar76 = auVar100._0_16_;
    if (auVar63._0_4_ < IVar112.Max.x) {
      IVar12 = (ImVec4)vinsertps_avx((undefined1  [16])IVar12,auVar76,0x20);
    }
    auVar62 = vshufps_avx((undefined1  [16])IVar12,(undefined1  [16])IVar12,0xff);
    auVar63 = vmovshdup_avx(auVar76);
    if (auVar62._0_4_ < auVar63._0_4_) {
      IVar12 = (ImVec4)vinsertps_avx((undefined1  [16])IVar12,auVar76,0x70);
    }
    iVar50 = iVar50 + 1;
    IVar13 = IVar12;
  }
  (pIVar25->DrawListSharedData).ClipRectFullscreen = IVar13;
  fVar55 = (pIVar25->Style).CircleTessellationMaxError;
  (pIVar25->DrawListSharedData).CurveTessellationTol = (pIVar25->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar25->DrawListSharedData,fVar55);
  bVar27 = (pIVar25->Style).AntiAliasedLines;
  uVar31 = (uint)bVar27;
  (pIVar25->DrawListSharedData).InitialFlags = (uint)bVar27;
  if (((pIVar25->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar25->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar31 = bVar27 | 2;
    (pIVar25->DrawListSharedData).InitialFlags = uVar31;
  }
  if ((pIVar25->Style).AntiAliasedFill == true) {
    uVar31 = uVar31 | 4;
    (pIVar25->DrawListSharedData).InitialFlags = uVar31;
  }
  if (((pIVar25->IO).BackendFlags & 8) != 0) {
    (pIVar25->DrawListSharedData).InitialFlags = uVar31 | 8;
  }
  for (iVar50 = 0; iVar50 < pIVar1->Size; iVar50 = iVar50 + 1) {
    ppIVar38 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar50);
    pIVar11 = *ppIVar38;
    (pIVar11->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar11->DrawDataP).field_0x1 = 0;
    (pIVar11->DrawDataP).CmdListsCount = 0;
    (pIVar11->DrawDataP).TotalIdxCount = 0;
    (pIVar11->DrawDataP).TotalVtxCount = 0;
    (pIVar11->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar11->DrawDataP).DisplayPos.x = 0.0;
    (pIVar11->DrawDataP).DisplayPos.y = 0.0;
    (pIVar11->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar11->DrawDataP).DisplayPos.x = 0.0;
    (pIVar11->DrawDataP).DisplayPos.y = 0.0;
    (pIVar11->DrawDataP).DisplaySize.x = 0.0;
    (pIVar11->DrawDataP).DisplaySize.y = 0.0;
    (pIVar11->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar11->DrawDataP).FramebufferScale.y = 0.0;
  }
  if ((pIVar25->DragDropActive != false) &&
     (IVar44 = (pIVar25->DragDropPayload).SourceId, IVar44 == pIVar25->ActiveId)) {
    KeepAliveID(IVar44);
  }
  if (pIVar25->HoveredIdPreviousFrame == 0) {
    IVar44 = pIVar25->HoveredId;
    pIVar25->HoveredIdTimer = 0.0;
    pIVar25->HoveredIdNotActiveTimer = 0.0;
    if (IVar44 == 0) goto LAB_001475a0;
LAB_00147575:
    fVar55 = (pIVar25->IO).DeltaTime;
    pIVar25->HoveredIdTimer = fVar55 + pIVar25->HoveredIdTimer;
    IVar32 = IVar44;
    if (pIVar25->ActiveId != IVar44) {
      pIVar25->HoveredIdNotActiveTimer = fVar55 + pIVar25->HoveredIdNotActiveTimer;
      IVar32 = pIVar25->ActiveId;
    }
  }
  else {
    IVar44 = pIVar25->HoveredId;
    if (IVar44 != 0) {
      if (pIVar25->ActiveId == IVar44) {
        pIVar25->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_00147575;
    }
LAB_001475a0:
    IVar44 = 0;
    IVar32 = pIVar25->ActiveId;
  }
  pIVar25->HoveredIdPreviousFrame = IVar44;
  pIVar25->HoveredIdPreviousFrameUsingMouseWheel = pIVar25->HoveredIdUsingMouseWheel;
  pIVar25->HoveredId = 0;
  pIVar25->HoveredIdAllowOverlap = false;
  pIVar25->HoveredIdUsingMouseWheel = false;
  pIVar25->HoveredIdDisabled = false;
  if (((pIVar25->ActiveIdIsAlive != IVar32) && (IVar32 != 0)) &&
     (pIVar25->ActiveIdPreviousFrame == IVar32)) {
    ClearActiveID();
    IVar32 = pIVar25->ActiveId;
  }
  fVar55 = (pIVar25->IO).DeltaTime;
  if (IVar32 != 0) {
    pIVar25->ActiveIdTimer = fVar55 + pIVar25->ActiveIdTimer;
  }
  pIVar25->LastActiveIdTimer = fVar55 + pIVar25->LastActiveIdTimer;
  pIVar25->ActiveIdPreviousFrame = IVar32;
  pIVar25->ActiveIdPreviousFrameWindow = pIVar25->ActiveIdWindow;
  pIVar25->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar25->ActiveIdHasBeenEditedBefore;
  pIVar25->ActiveIdIsAlive = 0;
  pIVar25->ActiveIdHasBeenEditedThisFrame = false;
  pIVar25->ActiveIdPreviousFrameIsAlive = false;
  pIVar25->ActiveIdIsJustActivated = false;
  if (pIVar25->TempInputId == 0) {
LAB_001476b3:
    if (IVar32 == 0) {
      pIVar25->ActiveIdUsingNavDirMask = 0;
      pIVar25->ActiveIdUsingNavInputMask = 0;
      pIVar25->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar32 != pIVar25->TempInputId) {
    pIVar25->TempInputId = 0;
    goto LAB_001476b3;
  }
  pIVar25->DragDropAcceptIdPrev = pIVar25->DragDropAcceptIdCurr;
  pIVar25->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar25->DragDropAcceptIdCurr = 0;
  pIVar25->DragDropWithinSource = false;
  pIVar25->DragDropWithinTarget = false;
  pIVar25->DragDropHoldJustPressedId = 0;
  IVar33 = GetMergedKeyModFlags();
  (pIVar25->IO).KeyMods = IVar33;
  memcpy((pIVar25->IO).KeysDownDurationPrev,(pIVar25->IO).KeysDownDuration,0x800);
  for (lVar37 = 0x144; pIVar49 = GImGui, lVar37 != 0x344; lVar37 = lVar37 + 1) {
    fVar56 = -1.0;
    if (*(char *)((long)(pIVar25->IO).KeyMap + lVar37 + -0x3c) == '\x01') {
      fVar58 = *(float *)((long)pIVar25 + lVar37 * 4 + -0x70);
      fVar56 = 0.0;
      if (0.0 <= fVar58) {
        fVar56 = fVar58 + fVar55;
      }
    }
    *(float *)((long)pIVar25 + lVar37 * 4 + -0x70) = fVar56;
  }
  (GImGui->IO).WantSetMousePos = false;
  pIVar49->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar49->NavWrapRequestFlags = 0;
  uVar31 = (pIVar49->IO).ConfigFlags;
  if (((uVar31 & 2) == 0) || (((pIVar49->IO).BackendFlags & 1) == 0)) {
    bVar24 = 0;
  }
  else {
    bVar24 = 1;
    if ((pIVar49->NavInputSource != ImGuiInputSource_NavGamepad) &&
       (((0.0 < (pIVar49->IO).NavInputs[0] || (0.0 < (pIVar49->IO).NavInputs[2])) ||
        ((0.0 < (pIVar49->IO).NavInputs[1] ||
         ((((0.0 < (pIVar49->IO).NavInputs[3] || (0.0 < (pIVar49->IO).NavInputs[4])) ||
           (0.0 < (pIVar49->IO).NavInputs[5])) ||
          ((0.0 < (pIVar49->IO).NavInputs[6] || (0.0 < (pIVar49->IO).NavInputs[7])))))))))) {
      pIVar49->NavInputSource = ImGuiInputSource_NavGamepad;
    }
  }
  if ((uVar31 & 1) != 0) {
    bVar27 = IsKeyDown((pIVar49->IO).KeyMap[0xc]);
    if (bVar27) {
      (pIVar49->IO).NavInputs[0] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar27 = IsKeyDown((pIVar49->IO).KeyMap[0xd]);
    if (bVar27) {
      (pIVar49->IO).NavInputs[2] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar27 = IsKeyDown((pIVar49->IO).KeyMap[0xe]);
    if (bVar27) {
      (pIVar49->IO).NavInputs[1] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar27 = IsKeyDown((pIVar49->IO).KeyMap[1]);
    if (bVar27) {
      (pIVar49->IO).NavInputs[0x11] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar27 = IsKeyDown((pIVar49->IO).KeyMap[2]);
    if (bVar27) {
      (pIVar49->IO).NavInputs[0x12] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar27 = IsKeyDown((pIVar49->IO).KeyMap[3]);
    if (bVar27) {
      (pIVar49->IO).NavInputs[0x13] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar27 = IsKeyDown((pIVar49->IO).KeyMap[4]);
    if (bVar27) {
      (pIVar49->IO).NavInputs[0x14] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar27 = (pIVar49->IO).KeyCtrl;
    if (bVar27 == true) {
      (pIVar49->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar49->IO).KeyShift == true) {
      (pIVar49->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar27 == false) && ((pIVar49->IO).KeyAlt != false)) {
      (pIVar49->IO).NavInputs[0x10] = 1.0;
    }
  }
  uVar59 = *(undefined8 *)(pIVar49->IO).NavInputsDownDuration;
  uVar86 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 2);
  uVar14 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 4);
  uVar15 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 6);
  uVar16 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 8);
  uVar17 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 10);
  uVar18 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 0xc);
  uVar19 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 0xe);
  uVar20 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 0xf);
  uVar21 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 0x11);
  uVar22 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 0x13);
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 0xd) =
       *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 0xd);
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 0xf) = uVar20;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 0x11) = uVar21;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 0x13) = uVar22;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 8) = uVar16;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 10) = uVar17;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 0xc) = uVar18;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 0xe) = uVar19;
  *(undefined8 *)(pIVar49->IO).NavInputsDownDurationPrev = uVar59;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 2) = uVar86;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 4) = uVar14;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 6) = uVar15;
  for (lVar37 = 0; pIVar26 = GImGui, lVar37 != 0x15; lVar37 = lVar37 + 1) {
    fVar55 = -1.0;
    if (0.0 < (pIVar49->IO).NavInputs[lVar37]) {
      fVar56 = (pIVar49->IO).NavInputsDownDuration[lVar37];
      fVar55 = 0.0;
      if (0.0 <= fVar56) {
        fVar55 = fVar56 + (pIVar49->IO).DeltaTime;
      }
    }
    (pIVar49->IO).NavInputsDownDuration[lVar37] = fVar55;
  }
  if ((pIVar49->NavInitResultId != 0) &&
     (((pIVar49->NavDisableHighlight != true || (pIVar49->NavInitRequestFromMove == true)) &&
      (GImGui->NavWindow != (ImGuiWindow *)0x0)))) {
    if (GImGui->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(GImGui->NavInitResultId,GImGui->NavLayer,0,&GImGui->NavInitResultRectRel);
    }
    else {
      SetNavID(GImGui->NavInitResultId,GImGui->NavLayer,0);
    }
    IVar60 = (pIVar26->NavInitResultRectRel).Max;
    pIVar5 = &pIVar26->NavWindow->NavRectRel[pIVar26->NavLayer].Min;
    *pIVar5 = (pIVar26->NavInitResultRectRel).Min;
    pIVar5[1] = IVar60;
  }
  pIVar49->NavInitRequest = false;
  pIVar49->NavInitRequestFromMove = false;
  pIVar49->NavInitResultId = 0;
  pIVar49->NavJustMovedToId = 0;
  pIVar26 = GImGui;
  if (pIVar49->NavMoveRequest == true) {
    IVar44 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar44 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar26->NavDisableHighlight = false;
        pIVar26->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar2 = &GImGui->NavMoveResultOther;
      pIVar54 = &GImGui->NavMoveResultLocal;
      if (IVar44 == 0) {
        pIVar54 = pIVar2;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar44 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar44 != 0)) &&
         (IVar44 != GImGui->NavId)) {
        pIVar54 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar54 == pIVar2) {
LAB_00147b85:
        pIVar54 = pIVar2;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar55 = (GImGui->NavMoveResultOther).DistBox;
        fVar56 = pIVar54->DistBox;
        if (fVar56 <= fVar55) {
          if (((fVar55 != fVar56) || (NAN(fVar55) || NAN(fVar56))) ||
             (pIVar54->DistCenter <= (GImGui->NavMoveResultOther).DistCenter)) goto LAB_00147b88;
        }
        goto LAB_00147b85;
      }
LAB_00147b88:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar39 = pIVar54->Window, pIVar39 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                      ,0x23fe,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar60 = (pIVar54->RectRel).Min;
          IVar7 = (pIVar54->RectRel).Max;
          fVar55 = (pIVar39->Pos).x;
          auVar88._0_4_ = IVar60.x + fVar55;
          fVar56 = (pIVar39->Pos).y;
          auVar88._4_4_ = IVar60.y + fVar56;
          auVar88._8_8_ = 0;
          auVar76._0_4_ = fVar55 + IVar7.x;
          auVar76._4_4_ = fVar56 + IVar7.y;
          auVar76._8_8_ = 0;
          _local_48 = (ImRect)vmovlhps_avx(auVar88,auVar76);
          IVar60 = ScrollToBringRectIntoView(pIVar54->Window,(ImRect *)local_48);
        }
        else {
          auVar63 = ZEXT816(0) << 0x40;
          if (GImGui->NavMoveDir == 2) {
            auVar63 = ZEXT416((uint)(pIVar39->ScrollMax).y);
          }
          (pIVar39->ScrollTarget).y = auVar63._0_4_;
          (pIVar39->ScrollTargetCenterRatio).y = 0.0;
          auVar63 = vinsertps_avx(auVar63,ZEXT416((uint)((pIVar39->Scroll).y - auVar63._0_4_)),0x1d)
          ;
          IVar60 = auVar63._0_8_;
          (pIVar39->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        auVar64._8_4_ = IVar60.x;
        auVar64._12_4_ = IVar60.y;
        auVar64._0_4_ = IVar60.x;
        auVar64._4_4_ = IVar60.y;
        IVar112 = (ImRect)vsubps_avx((undefined1  [16])pIVar54->RectRel,auVar64);
        pIVar54->RectRel = IVar112;
      }
      ClearActiveID();
      pIVar26->NavWindow = pIVar54->Window;
      IVar44 = pIVar54->ID;
      if (pIVar26->NavId == IVar44) {
        IVar32 = pIVar54->FocusScopeId;
      }
      else {
        pIVar26->NavJustMovedToId = IVar44;
        IVar32 = pIVar54->FocusScopeId;
        pIVar26->NavJustMovedToFocusScopeId = IVar32;
        pIVar26->NavJustMovedToKeyMods = pIVar26->NavMoveRequestKeyMods;
      }
      SetNavIDWithRectRel(IVar44,pIVar26->NavLayer,IVar32,&pIVar54->RectRel);
    }
  }
  if (pIVar49->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar49->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x22fa,"void ImGui::NavUpdate()");
    }
    if (((pIVar49->NavMoveResultLocal).ID == 0) && ((pIVar49->NavMoveResultOther).ID == 0)) {
      pIVar49->NavDisableHighlight = false;
    }
    pIVar49->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar49->NavMousePosDirty == true) && (pIVar49->NavIdIsAlive == true)) {
    if ((((pIVar49->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar49->IO).BackendFlags & 4) != 0 && (pIVar49->NavDisableHighlight == false)) &&
         (pIVar49->NavDisableMouseHover == true)) && (pIVar49->NavWindow != (ImGuiWindow *)0x0)))) {
      auVar83._0_8_ = NavCalcPreferredRefPos();
      auVar83._8_56_ = extraout_var;
      IVar60 = (ImVec2)vmovlps_avx(auVar83._0_16_);
      (pIVar49->IO).MousePosPrev = IVar60;
      IVar60 = (ImVec2)vmovlps_avx(auVar83._0_16_);
      (pIVar49->IO).MousePos = IVar60;
      (pIVar49->IO).WantSetMousePos = true;
    }
    pIVar49->NavMousePosDirty = false;
  }
  pIVar49->NavIdIsAlive = false;
  pIVar49->NavJustTabbedId = 0;
  IVar53 = pIVar49->NavLayer;
  if (ImGuiNavLayer_Menu < IVar53) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x2310,"void ImGui::NavUpdate()");
  }
  pIVar39 = pIVar49->NavWindow;
  pIVar45 = pIVar39;
  if (pIVar39 != (ImGuiWindow *)0x0) {
    for (; pIVar45 != (ImGuiWindow *)0x0; pIVar45 = pIVar45->ParentWindow) {
      if ((pIVar45->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar45 != pIVar39) {
          pIVar45->NavLastChildNavWindow = pIVar39;
        }
        break;
      }
    }
    if ((IVar53 == ImGuiNavLayer_Main) && (pIVar39->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar39->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar26 = GImGui;
  pIVar39 = GetTopMostPopupModal();
  if (pIVar39 != (ImGuiWindow *)0x0) {
    pIVar26->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar26->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar26->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    auVar65._0_12_ = ZEXT812(0);
    auVar65._12_4_ = 0;
    auVar76 = ZEXT416((uint)((pIVar26->IO).DeltaTime * -10.0 + pIVar26->NavWindowingHighlightAlpha))
    ;
    auVar63 = vcmpss_avx(auVar65,auVar76,2);
    auVar63 = vandps_avx(auVar63,auVar76);
    pIVar26->NavWindowingHighlightAlpha = auVar63._0_4_;
    if ((pIVar26->DimBgRatio <= 0.0) && (auVar63._0_4_ <= 0.0)) {
      pIVar26->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar39 == (ImGuiWindow *)0x0) && (pIVar26->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar27 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
    if ((pIVar26->NavWindowingTarget == (ImGuiWindow *)0x0) &&
       (((pIVar26->IO).KeyCtrl == true && (bVar28 = IsKeyPressedMap(0,true), bVar28)))) {
      bVar8 = (byte)(pIVar26->IO).ConfigFlags;
      uVar47 = (uint)bVar8;
      if (bVar27 || (bVar8 & 1) != 0) {
LAB_00147e6d:
        pIVar39 = pIVar26->NavWindow;
        if ((pIVar39 != (ImGuiWindow *)0x0) ||
           (pIVar39 = FindWindowNavFocusable((pIVar26->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
           pIVar39 != (ImGuiWindow *)0x0)) {
          pIVar39 = pIVar39->RootWindow;
          pIVar26->NavWindowingTargetAnim = pIVar39;
          pIVar26->NavWindowingTarget = pIVar39;
          pIVar26->NavWindowingTimer = 0.0;
          pIVar26->NavWindowingHighlightAlpha = 0.0;
          pIVar26->NavWindowingToggleLayer = (bool)(~(byte)uVar47 & 1);
          pIVar26->NavInputSource = ImGuiInputSource_NavGamepad - (uVar47 & 1);
        }
      }
    }
    else if (bVar27) {
      uVar47 = 0;
      goto LAB_00147e6d;
    }
  }
  fVar55 = (pIVar26->IO).DeltaTime + pIVar26->NavWindowingTimer;
  pIVar26->NavWindowingTimer = fVar55;
  local_38 = pIVar25;
  if (pIVar26->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_0014803d:
    bVar27 = false;
    pIVar39 = (ImGuiWindow *)0x0;
  }
  else {
    IVar34 = pIVar26->NavInputSource;
    if (IVar34 != ImGuiInputSource_NavGamepad) {
LAB_00147fbb:
      if (IVar34 == ImGuiInputSource_NavKeyboard) {
        auVar67._0_4_ = (pIVar26->NavWindowingTimer + -0.2) / 0.05;
        auVar67._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar76 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar67);
        auVar63 = vcmpss_avx(auVar67,ZEXT816(0) << 0x40,1);
        auVar63 = vandnps_avx(auVar63,auVar76);
        auVar76 = vcmpss_avx(auVar63,ZEXT416((uint)pIVar26->NavWindowingHighlightAlpha),2);
        auVar63 = vblendvps_avx(auVar63,ZEXT416((uint)pIVar26->NavWindowingHighlightAlpha),auVar76);
        pIVar26->NavWindowingHighlightAlpha = auVar63._0_4_;
        bVar27 = IsKeyPressedMap(0,true);
        if (bVar27) {
          NavUpdateWindowingHighlightWindow((pIVar26->IO).KeyShift - 1 | 1);
        }
        if ((pIVar26->IO).KeyCtrl == false) {
          pIVar39 = pIVar26->NavWindowingTarget;
          bVar27 = false;
          goto LAB_00148043;
        }
      }
      goto LAB_0014803d;
    }
    auVar66._0_4_ = (fVar55 + -0.2) / 0.05;
    auVar66._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar76 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar66);
    auVar63 = vcmpss_avx(auVar66,ZEXT816(0) << 0x40,1);
    auVar63 = vandnps_avx(auVar63,auVar76);
    auVar76 = vcmpss_avx(auVar63,ZEXT416((uint)pIVar26->NavWindowingHighlightAlpha),2);
    auVar63 = vblendvps_avx(auVar63,ZEXT416((uint)pIVar26->NavWindowingHighlightAlpha),auVar76);
    pIVar26->NavWindowingHighlightAlpha = auVar63._0_4_;
    bVar27 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar28 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar27 - (uint)bVar28 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar27 - (uint)bVar28);
      pIVar26->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar26->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0014803d;
      IVar34 = pIVar26->NavInputSource;
      goto LAB_00147fbb;
    }
    pbVar48 = &pIVar26->NavWindowingToggleLayer;
    *pbVar48 = (bool)(*pbVar48 & pIVar26->NavWindowingHighlightAlpha < 1.0);
    if (*pbVar48 == false) {
      pIVar39 = pIVar26->NavWindowingTarget;
      bVar27 = false;
    }
    else {
      bVar27 = pIVar26->NavWindow != (ImGuiWindow *)0x0;
      pIVar39 = (ImGuiWindow *)0x0;
    }
    pIVar26->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_00148043:
  dir_sources = 1;
  bVar28 = IsNavInputTest(0x10,ImGuiInputReadMode_Pressed);
  if (bVar28) {
    pIVar26->NavWindowingToggleLayer = true;
  }
  if ((((pIVar26->ActiveId == 0) || (pIVar26->ActiveIdAllowOverlap == true)) &&
      (pIVar26->NavWindowingToggleLayer == true)) &&
     (bVar28 = IsNavInputTest(0x10,ImGuiInputReadMode_Released), bVar28)) {
    bVar28 = IsMousePosValid(&(pIVar26->IO).MousePos);
    bVar29 = IsMousePosValid(&(pIVar26->IO).MousePosPrev);
    bVar27 = (bool)(bVar29 == bVar28 | bVar27);
  }
  pIVar45 = pIVar26->NavWindowingTarget;
  if ((pIVar45 != (ImGuiWindow *)0x0) && ((pIVar45->Flags & 4) == 0)) {
    if (pIVar26->NavInputSource == ImGuiInputSource_NavGamepad) {
      dir_sources = 4;
LAB_00148123:
      auVar84._0_8_ = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
      auVar84._8_56_ = extraout_var_00;
      auVar63 = auVar84._0_16_;
    }
    else {
      auVar63 = ZEXT816(0) << 0x40;
      if ((pIVar26->NavInputSource == ImGuiInputSource_NavKeyboard) &&
         ((pIVar26->IO).KeyShift == false)) goto LAB_00148123;
    }
    if (auVar63._0_4_ == 0.0) {
      auVar76 = vmovshdup_avx(auVar63);
      if ((auVar76._0_4_ == 0.0) && (!NAN(auVar76._0_4_))) goto LAB_001481bc;
    }
    auVar76 = vminss_avx(ZEXT416((uint)(pIVar26->IO).DisplayFramebufferScale.x),
                         ZEXT416((uint)(pIVar26->IO).DisplayFramebufferScale.y));
    auVar76 = vcvtdq2ps_avx(ZEXT416((uint)(int)((pIVar26->IO).DeltaTime * 800.0 * auVar76._0_4_)));
    pIVar45 = pIVar45->RootWindow;
    fVar55 = auVar76._0_4_;
    auVar68._0_4_ = (pIVar45->Pos).x + auVar63._0_4_ * fVar55;
    auVar68._4_4_ = (pIVar45->Pos).y + auVar63._4_4_ * fVar55;
    auVar68._8_4_ = auVar63._8_4_ * fVar55 + 0.0;
    auVar68._12_4_ = auVar63._12_4_ * fVar55 + 0.0;
    IVar60 = (ImVec2)vmovlps_avx(auVar68);
    local_48 = (undefined1  [8])IVar60;
    SetWindowPos(pIVar45,(ImVec2 *)local_48,1);
    MarkIniSettingsDirty(pIVar45);
    pIVar26->NavDisableMouseHover = true;
  }
LAB_001481bc:
  if (pIVar39 != (ImGuiWindow *)0x0) {
    if ((pIVar26->NavWindow == (ImGuiWindow *)0x0) || (pIVar39 != pIVar26->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar26->NavDisableHighlight = false;
      pIVar26->NavDisableMouseHover = true;
      pIVar45 = pIVar39->NavLastChildNavWindow;
      if ((pIVar45 == (ImGuiWindow *)0x0) || (pIVar45->WasActive == false)) {
        pIVar45 = pIVar39;
      }
      ClosePopupsOverWindow(pIVar45,false);
      FocusWindow(pIVar45);
      if (pIVar45->NavLastIds[0] == 0) {
        NavInitWindow(pIVar45,false);
      }
      if ((pIVar45->DC).NavLayerActiveMask == 2) {
        pIVar26->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar26->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar27) && (pIVar39 = pIVar26->NavWindow, pIVar45 = pIVar39, pIVar39 != (ImGuiWindow *)0x0))
  {
    while (window = pIVar45, window->ParentWindow != (ImGuiWindow *)0x0) {
      if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
         (pIVar45 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
    }
    if (window != pIVar39) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar39;
      pIVar39 = pIVar26->NavWindow;
    }
    pIVar26->NavDisableHighlight = false;
    pIVar26->NavDisableMouseHover = true;
    IVar53 = ImGuiNavLayer_Main;
    if (((pIVar39->DC).NavLayerActiveMask & 2) != 0) {
      IVar53 = pIVar26->NavLayer ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar53);
  }
  if (((bool)((uVar31 & 1) == 0 & (bVar24 ^ 1))) || (pIVar49->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar49->IO).NavActive = false;
LAB_0014831e:
    bVar27 = pIVar49->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar27 = (pIVar49->NavWindow->Flags & 0x40000U) == 0;
    (pIVar49->IO).NavActive = bVar27;
    if (((!bVar27) || (pIVar49->NavId == 0)) ||
       (bVar27 = true, pIVar49->NavDisableHighlight != false)) goto LAB_0014831e;
  }
  (pIVar49->IO).NavVisible = bVar27;
  bVar27 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar27) {
    if (pIVar49->ActiveId == 0) {
      pIVar39 = pIVar49->NavWindow;
      if (((pIVar39 == (ImGuiWindow *)0x0) || ((pIVar39->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar39->ParentWindow == (ImGuiWindow *)0x0)) {
        if ((pIVar49->OpenPopupStack).Size < 1) {
          if (pIVar49->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar39 != (ImGuiWindow *)0x0) && ((pIVar39->Flags & 0x5000000U) != 0x1000000)) {
              pIVar39->NavLastIds[0] = 0;
            }
            pIVar49->NavId = 0;
            pIVar49->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else {
          pIVar40 = ImVector<ImGuiPopupData>::back(&pIVar49->OpenPopupStack);
          if ((pIVar40->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar49->OpenPopupStack).Size + -1,true);
          }
        }
      }
      else {
        if (pIVar39->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                        ,0x232d,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar39->ParentWindow);
        SetNavID(pIVar39->ChildId,0,0);
        pIVar49->NavIdIsAlive = false;
        if (pIVar49->NavDisableMouseHover == true) {
          pIVar49->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar49->NavActivateId = 0;
  pIVar49->NavActivateDownId = 0;
  pIVar49->NavActivatePressedId = 0;
  pIVar49->NavInputId = 0;
  if (((pIVar49->NavId == 0) || (pIVar49->NavDisableHighlight != false)) ||
     (pIVar49->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_001484b4:
    pIVar39 = pIVar49->NavWindow;
    if (pIVar39 == (ImGuiWindow *)0x0) goto LAB_0014851e;
    if ((pIVar39->Flags & 0x40000) != 0) {
      pIVar49->NavDisableHighlight = true;
    }
    bVar27 = false;
  }
  else {
    if (pIVar49->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar49->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar27 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
          IVar44 = pIVar49->ActiveId;
          IVar32 = pIVar49->NavId;
          if (IVar44 == 0 && bVar27) {
            pIVar49->NavActivateId = IVar32;
            pIVar49->NavActivateDownId = IVar32;
LAB_001488dd:
            pIVar49->NavActivatePressedId = IVar32;
          }
          else if (IVar44 == 0) {
            pIVar49->NavActivateDownId = IVar32;
            if (bVar27) goto LAB_001488dd;
          }
          else {
            bVar28 = IVar44 == IVar32;
            if (!bVar28) goto LAB_001484b4;
            pIVar49->NavActivateDownId = IVar44;
            IVar32 = IVar44;
            if (bVar27 && bVar28) goto LAB_001488dd;
          }
LAB_001488e4:
          bVar27 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
          if (bVar27) {
            pIVar49->NavInputId = pIVar49->NavId;
          }
        }
        else if (pIVar49->ActiveId == pIVar49->NavId || pIVar49->ActiveId == 0) goto LAB_001488e4;
      }
      goto LAB_001484b4;
    }
LAB_0014851e:
    bVar27 = true;
    pIVar39 = (ImGuiWindow *)0x0;
  }
  IVar44 = pIVar49->NavActivateId;
  if ((IVar44 != 0) && (pIVar49->NavActivateDownId != IVar44)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x235b,"void ImGui::NavUpdate()");
  }
  pIVar49->NavMoveRequest = false;
  IVar44 = pIVar49->NavNextActivateId;
  if (IVar44 != 0) {
    pIVar49->NavActivateId = IVar44;
    pIVar49->NavActivateDownId = IVar44;
    pIVar49->NavActivatePressedId = IVar44;
    pIVar49->NavInputId = IVar44;
  }
  pIVar49->NavNextActivateId = 0;
  if (pIVar49->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar49->NavMoveDir = -1;
    pIVar49->NavMoveRequestFlags = 0;
    if (((!bVar27) && (pIVar49->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar39->Flags & 0x40000) == 0)) {
      if (((GImGui->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar27 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar27 ||
          (bVar27 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar27)))) {
        pIVar49->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar27 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar27 ||
          (bVar27 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar27)))) {
        pIVar49->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar27 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar27 ||
          (bVar27 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar27)))) {
        pIVar49->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar27 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar27 ||
          (bVar27 = IsNavInputTest(0x14,ImGuiInputReadMode_Repeat), bVar27)))) {
        pIVar49->NavMoveDir = 3;
      }
    }
    pIVar49->NavMoveClipDir = pIVar49->NavMoveDir;
  }
  else {
    if ((pIVar49->NavMoveDir == -1) || (pIVar49->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x2376,"void ImGui::NavUpdate()");
    }
    if (pIVar49->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x2377,"void ImGui::NavUpdate()");
    }
    pIVar49->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar25 = GImGui;
  local_68 = 0.0;
  if ((((((uVar31 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar39 = GImGui->NavWindow, pIVar39 != (ImGuiWindow *)0x0)) &&
      (((pIVar39->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar27 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar29 = false;
    bVar28 = false;
    if (bVar27) {
      bVar28 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar27 = IsKeyDown((pIVar25->IO).KeyMap[6]);
    if (bVar27) {
      bVar29 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar27 = IsKeyPressed((pIVar25->IO).KeyMap[7],true);
    if (bVar27) {
      bVar27 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar27 = false;
    }
    bVar30 = IsKeyPressed((pIVar25->IO).KeyMap[8],true);
    if (bVar30) {
      bVar30 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar30 = false;
    }
    local_68 = 0.0;
    if ((bVar28 != bVar29) || (bVar27 != bVar30)) {
      if (((pIVar39->DC).NavLayerActiveMask == 0) && ((pIVar39->DC).NavHasScroll == true)) {
        bVar28 = IsKeyPressed((pIVar25->IO).KeyMap[5],true);
        if (bVar28) {
          fVar55 = (pIVar39->Scroll).y - ((pIVar39->InnerRect).Max.y - (pIVar39->InnerRect).Min.y);
LAB_00149a2f:
          (pIVar39->ScrollTarget).y = fVar55;
        }
        else {
          bVar28 = IsKeyPressed((pIVar25->IO).KeyMap[6],true);
          if (bVar28) {
            fVar55 = ((pIVar39->InnerRect).Max.y - (pIVar39->InnerRect).Min.y) + (pIVar39->Scroll).y
            ;
            goto LAB_00149a2f;
          }
          if (bVar27 == false) {
            if (bVar30 == false) goto LAB_00149a42;
            fVar55 = (pIVar39->ScrollMax).y;
            goto LAB_00149a2f;
          }
          (pIVar39->ScrollTarget).y = 0.0;
        }
        (pIVar39->ScrollTargetCenterRatio).y = 0.0;
        (pIVar39->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_00149a42:
        local_68 = 0.0;
      }
      else {
        IVar53 = pIVar25->NavLayer;
        fVar55 = (pIVar39->InnerRect).Max.y;
        fVar56 = (pIVar39->InnerRect).Min.y;
        fVar58 = ImGuiWindow::CalcFontSize(pIVar39);
        auVar99._0_12_ = ZEXT812(0);
        auVar99._12_4_ = 0;
        auVar76 = ZEXT416((uint)(((fVar55 - fVar56) - fVar58) +
                                (pIVar39->NavRectRel[IVar53].Max.y -
                                pIVar39->NavRectRel[IVar53].Min.y)));
        auVar63 = vcmpss_avx(auVar76,auVar99,2);
        auVar63 = vandnps_avx(auVar63,auVar76);
        bVar28 = IsKeyPressed((pIVar25->IO).KeyMap[5],true);
        local_68 = auVar63._0_4_;
        if (bVar28) {
          local_68 = -local_68;
          pIVar25->NavMoveDir = 3;
          pIVar25->NavMoveClipDir = 2;
          pIVar25->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar28 = IsKeyPressed((pIVar25->IO).KeyMap[6],true);
          if (!bVar28) {
            pIVar43 = pIVar39->NavRectRel + IVar53;
            if (bVar27 == false) {
              local_68 = 0.0;
              if (bVar30 != false) {
                fVar55 = ((pIVar39->ScrollMax).y + (pIVar39->SizeFull).y) - (pIVar39->Scroll).y;
                pIVar39->NavRectRel[IVar53].Max.y = fVar55;
                pIVar39->NavRectRel[IVar53].Min.y = fVar55;
                if (pIVar39->NavRectRel[IVar53].Max.x < (pIVar43->Min).x) {
                  pIVar39->NavRectRel[IVar53].Max.x = 0.0;
                  (pIVar43->Min).x = 0.0;
                }
                pIVar25->NavMoveDir = 2;
                pIVar25->NavMoveRequestFlags = 0x50;
              }
              goto LAB_001486ec;
            }
            fVar55 = -(pIVar39->Scroll).y;
            pIVar39->NavRectRel[IVar53].Max.y = fVar55;
            pIVar39->NavRectRel[IVar53].Min.y = fVar55;
            if (pIVar39->NavRectRel[IVar53].Max.x < (pIVar43->Min).x) {
              pIVar39->NavRectRel[IVar53].Max.x = 0.0;
              (pIVar43->Min).x = 0.0;
            }
            pIVar25->NavMoveDir = 3;
            pIVar25->NavMoveRequestFlags = 0x50;
            goto LAB_00149a42;
          }
          pIVar25->NavMoveDir = 2;
          pIVar25->NavMoveClipDir = 3;
          pIVar25->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_001486ec:
  if (pIVar49->NavMoveDir == -1) {
    if ((pIVar49->NavMoveRequest & 1U) != 0) goto LAB_00148726;
  }
  else {
    pIVar49->NavMoveRequest = true;
    pIVar49->NavMoveRequestKeyMods = (pIVar49->IO).KeyMods;
    pIVar49->NavMoveDirLast = pIVar49->NavMoveDir;
LAB_00148726:
    if (pIVar49->NavId == 0) {
      pIVar49->NavInitRequest = true;
      pIVar49->NavInitRequestFromMove = true;
      pIVar49->NavInitResultId = 0;
      pIVar49->NavDisableHighlight = false;
    }
  }
  NavUpdateAnyRequestFlag();
  pIVar39 = pIVar49->NavWindow;
  if (((pIVar39 != (ImGuiWindow *)0x0) && ((pIVar39->Flags & 0x40000) == 0)) &&
     (pIVar49->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar55 = ImGuiWindow::CalcFontSize(pIVar39);
    auVar63 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar55 * 100.0 * (pIVar49->IO).DeltaTime + 0.5)));
    fVar55 = auVar63._0_4_;
    if ((((pIVar39->DC).NavLayerActiveMask == 0) && ((pIVar39->DC).NavHasScroll == true)) &&
       (pIVar49->NavMoveRequest == true)) {
      uVar31 = pIVar49->NavMoveDir;
      if (uVar31 < 2) {
        lVar37 = 0x7c;
        lVar46 = 0x74;
        lVar52 = 0x6c;
        uVar47 = 0;
        lStack_70 = 0x5c;
      }
      else {
        if ((uVar31 & 0xfffffffe) != 2) goto LAB_0014897b;
        uVar47 = 2;
        lVar37 = 0x80;
        lVar46 = 0x78;
        lVar52 = 0x70;
        lStack_70 = 0x60;
      }
      auVar63 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar55 * *(float *)(&DAT_001d4ae8 +
                                                                     (ulong)(uVar31 == uVar47) * 4)
                                                 + *(float *)((long)&pIVar39->Name + lStack_70))));
      *(int *)((long)&pIVar39->Name + lVar52) = auVar63._0_4_;
      *(undefined4 *)((long)&pIVar39->Name + lVar46) = 0;
      *(undefined4 *)((long)&pIVar39->Name + lVar37) = 0;
    }
LAB_0014897b:
    auVar85._0_8_ = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    auVar85._8_56_ = extraout_var_01;
    fVar56 = auVar85._0_4_;
    if (((fVar56 != 0.0) || (NAN(fVar56))) && (pIVar39->ScrollbarX == true)) {
      auVar63 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar56 * fVar55 + (pIVar39->Scroll).x)));
      (pIVar39->ScrollTarget).x = auVar63._0_4_;
      (pIVar39->ScrollTargetCenterRatio).x = 0.0;
      (pIVar39->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    auVar63 = vmovshdup_avx(auVar85._0_16_);
    fVar56 = auVar63._0_4_;
    if ((fVar56 != 0.0) || (NAN(fVar56))) {
      auVar63 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar56 * fVar55 + (pIVar39->Scroll).y)));
      (pIVar39->ScrollTarget).y = auVar63._0_4_;
      (pIVar39->ScrollTargetCenterRatio).y = 0.0;
      (pIVar39->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  IVar112 = (ImRect)(ZEXT816(0) << 0x40);
  (pIVar49->NavMoveResultLocal).Window = (ImGuiWindow *)IVar112.Min;
  (pIVar49->NavMoveResultLocal).ID = (ImGuiID)IVar112.Max.x;
  (pIVar49->NavMoveResultLocal).FocusScopeId = (ImGuiID)IVar112.Max.y;
  (pIVar49->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  auVar69._8_4_ = 0x7f7fffff;
  auVar69._0_8_ = 0x7f7fffff7f7fffff;
  auVar69._12_4_ = 0x7f7fffff;
  uVar59 = vmovlps_avx(auVar69);
  (pIVar49->NavMoveResultLocal).DistBox = (float)(int)uVar59;
  (pIVar49->NavMoveResultLocal).DistCenter = (float)(int)((ulong)uVar59 >> 0x20);
  (pIVar49->NavMoveResultLocal).RectRel = IVar112;
  (pIVar49->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)IVar112.Min;
  (pIVar49->NavMoveResultLocalVisibleSet).ID = (ImGuiID)IVar112.Max.x;
  (pIVar49->NavMoveResultLocalVisibleSet).FocusScopeId = (ImGuiID)IVar112.Max.y;
  (pIVar49->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  uVar59 = vmovlps_avx(auVar69);
  (pIVar49->NavMoveResultLocalVisibleSet).DistBox = (float)(int)uVar59;
  (pIVar49->NavMoveResultLocalVisibleSet).DistCenter = (float)(int)((ulong)uVar59 >> 0x20);
  (pIVar49->NavMoveResultLocalVisibleSet).RectRel = IVar112;
  (pIVar49->NavMoveResultOther).Window = (ImGuiWindow *)IVar112.Min;
  (pIVar49->NavMoveResultOther).ID = (ImGuiID)IVar112.Max.x;
  (pIVar49->NavMoveResultOther).FocusScopeId = (ImGuiID)IVar112.Max.y;
  (pIVar49->NavMoveResultOther).DistAxial = 3.4028235e+38;
  uVar59 = vmovlps_avx(auVar69);
  (pIVar49->NavMoveResultOther).DistBox = (float)(int)uVar59;
  (pIVar49->NavMoveResultOther).DistCenter = (float)(int)((ulong)uVar59 >> 0x20);
  (pIVar49->NavMoveResultOther).RectRel = IVar112;
  if (((pIVar49->NavMoveRequest == true) && (pIVar49->NavInputSource == ImGuiInputSource_NavGamepad)
      ) && (pIVar49->NavLayer == ImGuiNavLayer_Main)) {
    pIVar39 = pIVar49->NavWindow;
    auVar70._8_8_ = 0;
    auVar70._0_4_ = (pIVar39->Pos).x;
    auVar70._4_4_ = (pIVar39->Pos).y;
    auVar89._8_8_ = 0;
    auVar89._0_4_ = (pIVar39->InnerRect).Min.x;
    auVar89._4_4_ = (pIVar39->InnerRect).Min.y;
    auVar63 = vsubps_avx(auVar89,auVar70);
    auVar102._8_4_ = 0xbf800000;
    auVar102._0_8_ = 0xbf800000bf800000;
    auVar102._12_4_ = 0xbf800000;
    auVar110._8_8_ = 0;
    auVar110._0_4_ = (pIVar39->InnerRect).Max.x;
    auVar110._4_4_ = (pIVar39->InnerRect).Max.y;
    auVar76 = vsubps_avx(auVar110,auVar70);
    auVar63 = vmovlhps_avx(auVar63,auVar76);
    auVar90._8_4_ = 0x3f800000;
    auVar90._0_8_ = 0x3f8000003f800000;
    auVar90._12_4_ = 0x3f800000;
    auVar76 = vmovlhps_avx(auVar102,auVar90);
    local_48._4_4_ = auVar63._4_4_ + auVar76._4_4_;
    local_48._0_4_ = auVar63._0_4_ + auVar76._0_4_;
    IStack_40.x = auVar63._8_4_ + auVar76._8_4_;
    IStack_40.y = auVar63._12_4_ + auVar76._12_4_;
    bVar27 = ImRect::Contains((ImRect *)local_48,pIVar39->NavRectRel);
    if (!bVar27) {
      fVar55 = ImGuiWindow::CalcFontSize(pIVar39);
      IVar112 = _local_48;
      fVar55 = fVar55 * 0.5;
      auVar103._8_4_ = IStack_40.x;
      auVar103._12_4_ = IStack_40.y;
      auVar103._0_4_ = IStack_40.x;
      auVar103._4_4_ = IStack_40.y;
      auVar63 = vsubps_avx(auVar103,(undefined1  [16])IVar112);
      auVar71._4_4_ = fVar55;
      auVar71._0_4_ = fVar55;
      auVar71._8_4_ = fVar55;
      auVar71._12_4_ = fVar55;
      auVar63 = vminps_avx(auVar63,auVar71);
      auVar104._8_8_ = auVar63._0_8_;
      auVar104._0_8_ = auVar63._0_8_;
      local_48._4_4_ = IVar112.Min.y + auVar63._4_4_;
      local_48._0_4_ = IVar112.Min.x + auVar63._0_4_;
      auVar63 = vsubps_avx((undefined1  [16])IVar112,auVar104);
      IStack_40 = auVar63._8_8_;
      ImRect::ClipWithFull(pIVar39->NavRectRel + pIVar49->NavLayer,(ImRect *)local_48);
      pIVar49->NavId = 0;
      pIVar49->NavFocusScopeId = 0;
    }
    IVar112 = (ImRect)(ZEXT816(0) << 0x40);
  }
  pIVar39 = pIVar49->NavWindow;
  if (pIVar39 == (ImGuiWindow *)0x0) {
    fVar55 = 0.0;
    auVar63 = SUB6416(ZEXT464(0x3f800000),0);
  }
  else {
    IVar53 = pIVar49->NavLayer;
    IVar60 = pIVar39->Pos;
    auVar91._8_8_ = 0;
    auVar91._0_4_ = IVar60.x;
    auVar91._4_4_ = IVar60.y;
    auVar63 = vmovshdup_avx(auVar91);
    fVar55 = auVar63._0_4_ + pIVar39->NavRectRel[IVar53].Min.y;
    IVar7 = pIVar39->NavRectRel[IVar53].Max;
    IVar112.Min.x = IVar7.x + IVar60.x;
    IVar112.Min.y = IVar7.y + IVar60.y;
    IVar112.Max.x = 0.0;
    IVar112.Max.y = 0.0;
    auVar63 = ZEXT416((uint)(IVar60.x + pIVar39->NavRectRel[IVar53].Min.x + 1.0));
  }
  (pIVar49->NavScoringRect).Min.y = local_68 + fVar55;
  auVar76 = vmovshdup_avx((undefined1  [16])IVar112);
  fVar56 = local_68 + auVar76._0_4_;
  (pIVar49->NavScoringRect).Max.y = fVar56;
  auVar63 = vminss_avx(auVar63,(undefined1  [16])IVar112);
  (pIVar49->NavScoringRect).Min.x = auVar63._0_4_;
  (pIVar49->NavScoringRect).Max.x = auVar63._0_4_;
  if (fVar56 < local_68 + fVar55) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x23c6,"void ImGui::NavUpdate()");
  }
  pIVar49->NavScoringCount = 0;
  pIVar25 = GImGui;
  pIVar5 = &(GImGui->IO).MousePos;
  bVar27 = IsMousePosValid(pIVar5);
  if (bVar27) {
    IVar60 = (pIVar25->IO).MousePos;
    auVar72._0_4_ = (int)IVar60.x;
    auVar72._4_4_ = (int)IVar60.y;
    auVar72._8_8_ = 0;
    auVar63 = vcvtdq2ps_avx(auVar72);
    IVar60 = (ImVec2)vmovlps_avx(auVar63);
    pIVar25->LastValidMousePos = IVar60;
    IVar60 = (ImVec2)vmovlps_avx(auVar63);
    (pIVar25->IO).MousePos = IVar60;
  }
  bVar27 = IsMousePosValid(pIVar5);
  if ((bVar27) && (bVar27 = IsMousePosValid(&(pIVar25->IO).MousePosPrev), bVar27)) {
    auVar73._8_8_ = 0;
    auVar73._0_4_ = (pIVar25->IO).MousePos.x;
    auVar73._4_4_ = (pIVar25->IO).MousePos.y;
    auVar92._8_8_ = 0;
    auVar92._0_4_ = (pIVar25->IO).MousePosPrev.x;
    auVar92._4_4_ = (pIVar25->IO).MousePosPrev.y;
    auVar63 = vsubps_avx(auVar73,auVar92);
    IVar60 = (ImVec2)vmovlps_avx(auVar63);
    (pIVar25->IO).MouseDelta = IVar60;
    if ((auVar63._0_4_ == 0.0) && (!NAN(auVar63._0_4_))) {
      auVar63 = vmovshdup_avx(auVar63);
      if ((auVar63._0_4_ == 0.0) && (!NAN(auVar63._0_4_))) goto LAB_00148cb3;
    }
    pIVar25->NavDisableMouseHover = false;
  }
  else {
    (pIVar25->IO).MouseDelta.x = 0.0;
    (pIVar25->IO).MouseDelta.y = 0.0;
  }
LAB_00148cb3:
  (pIVar25->IO).MousePosPrev = (pIVar25->IO).MousePos;
  for (lVar37 = 0; lVar37 != 5; lVar37 = lVar37 + 1) {
    if ((pIVar25->IO).MouseDown[lVar37] == true) {
      fVar55 = (pIVar25->IO).MouseDownDuration[lVar37];
      pbVar48 = (pIVar25->IO).MouseClicked + lVar37;
      *pbVar48 = fVar55 < 0.0;
      pbVar48[10] = false;
      (pIVar25->IO).MouseDownDurationPrev[lVar37] = fVar55;
      if (0.0 <= fVar55) {
        (pIVar25->IO).MouseDownDuration[lVar37] = fVar55 + (pIVar25->IO).DeltaTime;
        (pIVar25->IO).MouseDoubleClicked[lVar37] = false;
        bVar27 = IsMousePosValid(pIVar5);
        auVar63 = ZEXT816(0) << 0x40;
        if (bVar27) {
          auVar75._8_8_ = 0;
          auVar75._0_4_ = (pIVar25->IO).MousePos.x;
          auVar75._4_4_ = (pIVar25->IO).MousePos.y;
          pIVar6 = (pIVar25->IO).MouseClickedPos + lVar37;
          auVar95._8_8_ = 0;
          auVar95._0_4_ = pIVar6->x;
          auVar95._4_4_ = pIVar6->y;
          auVar63 = vsubps_avx(auVar75,auVar95);
        }
        fVar55 = auVar63._0_4_;
        auVar105._0_4_ = fVar55 * fVar55;
        auVar105._4_4_ = auVar63._4_4_ * auVar63._4_4_;
        fVar56 = auVar63._8_4_;
        auVar105._8_4_ = fVar56 * fVar56;
        fVar58 = auVar63._12_4_;
        auVar105._12_4_ = fVar58 * fVar58;
        auVar76 = vmovshdup_avx(auVar105);
        auVar62 = ZEXT416((uint)(pIVar25->IO).MouseDragMaxDistanceSqr[lVar37]);
        auVar88 = ZEXT416((uint)(fVar55 * fVar55 + auVar76._0_4_));
        auVar76 = vcmpss_avx(auVar88,auVar62,2);
        auVar76 = vblendvps_avx(auVar88,auVar62,auVar76);
        (pIVar25->IO).MouseDragMaxDistanceSqr[lVar37] = auVar76._0_4_;
        pIVar6 = (pIVar25->IO).MouseDragMaxDistanceAbs + lVar37;
        auVar96._8_8_ = 0;
        auVar96._0_4_ = pIVar6->x;
        auVar96._4_4_ = pIVar6->y;
        auVar106._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
        auVar106._8_4_ = -fVar56;
        auVar106._12_4_ = -fVar58;
        auVar76 = vmaxps_avx(auVar106,auVar63);
        auVar63 = vcmpps_avx(auVar76,auVar96,2);
        auVar63 = vblendvps_avx(auVar76,auVar96,auVar63);
        IVar60 = (ImVec2)vmovlps_avx(auVar63);
        (pIVar25->IO).MouseDragMaxDistanceAbs[lVar37] = IVar60;
      }
      else {
        (pIVar25->IO).MouseDownDuration[lVar37] = 0.0;
        (pIVar25->IO).MouseDoubleClicked[lVar37] = false;
        dVar61 = pIVar25->Time;
        if ((float)(dVar61 - (pIVar25->IO).MouseClickedTime[lVar37]) <
            (pIVar25->IO).MouseDoubleClickTime) {
          bVar27 = IsMousePosValid(pIVar5);
          auVar63 = ZEXT816(0) << 0x40;
          if (bVar27) {
            auVar74._8_8_ = 0;
            auVar74._0_4_ = (pIVar25->IO).MousePos.x;
            auVar74._4_4_ = (pIVar25->IO).MousePos.y;
            pIVar6 = (pIVar25->IO).MouseClickedPos + lVar37;
            auVar93._8_8_ = 0;
            auVar93._0_4_ = pIVar6->x;
            auVar93._4_4_ = pIVar6->y;
            auVar63 = vsubps_avx(auVar74,auVar93);
          }
          fVar56 = auVar63._0_4_;
          auVar94._0_4_ = fVar56 * fVar56;
          auVar94._4_4_ = auVar63._4_4_ * auVar63._4_4_;
          auVar94._8_4_ = auVar63._8_4_ * auVar63._8_4_;
          auVar94._12_4_ = auVar63._12_4_ * auVar63._12_4_;
          auVar63 = vmovshdup_avx(auVar94);
          fVar55 = (pIVar25->IO).MouseDoubleClickMaxDist;
          if (fVar56 * fVar56 + auVar63._0_4_ < fVar55 * fVar55) {
            (pIVar25->IO).MouseDoubleClicked[lVar37] = true;
          }
          dVar61 = (double)((pIVar25->IO).MouseDoubleClickTime * -2.0);
        }
        (pIVar25->IO).MouseClickedTime[lVar37] = dVar61;
        (pIVar25->IO).MouseClickedPos[lVar37] = (pIVar25->IO).MousePos;
        (pIVar25->IO).MouseDownWasDoubleClick[lVar37] = (pIVar25->IO).MouseDoubleClicked[lVar37];
        pIVar6 = (pIVar25->IO).MouseDragMaxDistanceAbs + lVar37;
        pIVar6->x = 0.0;
        pIVar6->y = 0.0;
        (pIVar25->IO).MouseDragMaxDistanceSqr[lVar37] = 0.0;
      }
    }
    else {
      (pIVar25->IO).MouseClicked[lVar37] = false;
      fVar55 = (pIVar25->IO).MouseDownDuration[lVar37];
      (pIVar25->IO).MouseReleased[lVar37] = 0.0 <= fVar55;
      pbVar48 = (pIVar25->IO).MouseClicked + lVar37;
      (pIVar25->IO).MouseDownDurationPrev[lVar37] = fVar55;
      (pIVar25->IO).MouseDownDuration[lVar37] = -1.0;
      (pIVar25->IO).MouseDoubleClicked[lVar37] = false;
    }
    if (((pIVar25->IO).MouseDown[lVar37] == false) && ((pIVar25->IO).MouseReleased[lVar37] == false)
       ) {
      (pIVar25->IO).MouseDownWasDoubleClick[lVar37] = false;
    }
    if (*pbVar48 == true) {
      pIVar25->NavDisableMouseHover = false;
    }
  }
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar39 = GetTopMostPopupModal();
  pIVar25 = local_38;
  if ((pIVar39 != (ImGuiWindow *)0x0) ||
     ((local_38->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < local_38->NavWindowingHighlightAlpha)))) {
    auVar63 = vminss_avx(ZEXT416((uint)((local_38->IO).DeltaTime * 6.0 + local_38->DimBgRatio)),
                         ZEXT416(0x3f800000));
    fVar55 = auVar63._0_4_;
  }
  else {
    auVar76 = ZEXT416((uint)((local_38->IO).DeltaTime * -10.0 + local_38->DimBgRatio));
    auVar63 = vcmpss_avx(ZEXT816(0) << 0x40,auVar76,2);
    auVar63 = vandps_avx(auVar63,auVar76);
    fVar55 = auVar63._0_4_;
  }
  local_38->DimBgRatio = fVar55;
  local_38->MouseCursor = 0;
  local_38->WantTextInputNextFrame = -1;
  local_38->WantCaptureMouseNextFrame = -1;
  local_38->WantCaptureKeyboardNextFrame = -1;
  (local_38->PlatformImePos).x = 1.0;
  pIVar49 = GImGui;
  (local_38->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar27 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar27) &&
        (fVar55 = (pIVar49->IO).MouseDragThreshold,
        fVar56 = (pIVar49->IO).MousePos.x - (pIVar49->WheelingWindowRefMousePos).x,
        fVar58 = (pIVar49->IO).MousePos.y - (pIVar49->WheelingWindowRefMousePos).y,
        fVar55 * fVar55 < fVar56 * fVar56 + fVar58 * fVar58)) ||
       (pIVar49->WheelingWindowTimer <= 0.0)) {
      pIVar49->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar49->WheelingWindowTimer = 0.0;
    }
  }
  fVar55 = (pIVar49->IO).MouseWheel;
  if (((((fVar55 != 0.0) || (fVar56 = (pIVar49->IO).MouseWheelH, fVar56 != 0.0)) || (NAN(fVar56)))
      && ((pIVar49->ActiveId == 0 || (pIVar49->ActiveIdUsingMouseWheel == false)))) &&
     (((pIVar49->HoveredIdPreviousFrame == 0 ||
       (pIVar49->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
      (((pIVar39 = pIVar49->WheelingWindow, pIVar39 != (ImGuiWindow *)0x0 ||
        (pIVar39 = pIVar49->HoveredWindow, pIVar39 != (ImGuiWindow *)0x0)) &&
       (pIVar39->Collapsed == false)))))) {
    if ((fVar55 != 0.0) || (NAN(fVar55))) {
      if ((pIVar49->IO).KeyCtrl == true) {
        if ((pIVar49->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar39);
          fVar55 = pIVar39->FontWindowScale;
          auVar76 = ZEXT416((uint)((pIVar49->IO).MouseWheel * 0.1 + fVar55));
          auVar63 = vcmpss_avx(auVar76,ZEXT416(0x3f000000),1);
          auVar76 = vminss_avx(SUB6416(ZEXT464(0x40200000),0),auVar76);
          auVar107._8_4_ = 0x3f000000;
          auVar107._0_8_ = 0x3f0000003f000000;
          auVar107._12_4_ = 0x3f000000;
          auVar63 = vblendvps_avx(auVar76,auVar107,auVar63);
          pIVar39->FontWindowScale = auVar63._0_4_;
          if ((pIVar39->Flags & 0x1000000) == 0) {
            fVar55 = auVar63._0_4_ / fVar55;
            fVar56 = 1.0 - fVar55;
            IVar60 = pIVar39->Pos;
            auVar97._8_8_ = 0;
            auVar97._0_4_ = IVar60.x;
            auVar97._4_4_ = IVar60.y;
            IVar7 = pIVar39->Size;
            auVar108._8_8_ = 0;
            auVar108._0_4_ = IVar7.x;
            auVar108._4_4_ = IVar7.y;
            auVar111._8_8_ = 0;
            auVar111._0_4_ = (pIVar49->IO).MousePos.x;
            auVar111._4_4_ = (pIVar49->IO).MousePos.y;
            auVar63 = vsubps_avx(auVar111,auVar97);
            auVar77._0_4_ = fVar56 * IVar7.x * auVar63._0_4_;
            auVar77._4_4_ = fVar56 * IVar7.y * auVar63._4_4_;
            auVar77._8_4_ = fVar56 * 0.0 * auVar63._8_4_;
            auVar77._12_4_ = fVar56 * 0.0 * auVar63._12_4_;
            auVar63 = vdivps_avx(auVar77,auVar108);
            auVar78._0_4_ = IVar60.x + auVar63._0_4_;
            auVar78._4_4_ = IVar60.y + auVar63._4_4_;
            auVar78._8_4_ = auVar63._8_4_ + 0.0;
            auVar78._12_4_ = auVar63._12_4_ + 0.0;
            IVar60 = (ImVec2)vmovlps_avx(auVar78);
            local_48 = (undefined1  [8])IVar60;
            SetWindowPos(pIVar39,(ImVec2 *)local_48,0);
            auVar98._0_4_ = (int)(fVar55 * (pIVar39->Size).x);
            auVar98._4_4_ = (int)(fVar55 * (pIVar39->Size).y);
            auVar98._8_4_ = (int)(fVar55 * 0.0);
            auVar98._12_4_ = (int)(fVar55 * 0.0);
            auVar63 = vcvtdq2ps_avx(auVar98);
            auVar79._0_4_ = (int)(fVar55 * (pIVar39->SizeFull).x);
            auVar79._4_4_ = (int)(fVar55 * (pIVar39->SizeFull).y);
            auVar79._8_4_ = (int)(fVar55 * 0.0);
            auVar79._12_4_ = (int)(fVar55 * 0.0);
            auVar76 = vcvtdq2ps_avx(auVar79);
            auVar63 = vmovlhps_avx(auVar63,auVar76);
            (pIVar39->Size).x = (float)(int)auVar63._0_8_;
            (pIVar39->Size).y = (float)(int)((ulong)auVar63._0_8_ >> 0x20);
            (pIVar39->SizeFull).x = (float)(int)auVar63._8_8_;
            (pIVar39->SizeFull).y = (float)(int)((ulong)auVar63._8_8_ >> 0x20);
          }
          goto LAB_001490dc;
        }
      }
      else if ((pIVar49->IO).KeyShift == false) {
        StartLockWheelingWindow(pIVar39);
        while ((uVar31 = pIVar39->Flags, (uVar31 >> 0x18 & 1) != 0 &&
               (((uVar31 & 0x210) == 0x10 ||
                ((fVar56 = (pIVar39->ScrollMax).y, fVar56 == 0.0 && (!NAN(fVar56)))))))) {
          pIVar39 = pIVar39->ParentWindow;
        }
        if ((uVar31 & 0x210) == 0) {
          fVar56 = (pIVar39->InnerRect).Max.y;
          fVar58 = (pIVar39->InnerRect).Min.y;
          fVar57 = ImGuiWindow::CalcFontSize(pIVar39);
          auVar63 = vminss_avx(ZEXT416((uint)(fVar57 * 5.0)),
                               ZEXT416((uint)((fVar56 - fVar58) * 0.67)));
          auVar80._0_4_ = (int)auVar63._0_4_;
          auVar80._4_4_ = (int)auVar63._4_4_;
          auVar80._8_4_ = (int)auVar63._8_4_;
          auVar80._12_4_ = (int)auVar63._12_4_;
          auVar63 = vcvtdq2ps_avx(auVar80);
          (pIVar39->ScrollTarget).y = (pIVar39->Scroll).y - auVar63._0_4_ * fVar55;
          (pIVar39->ScrollTargetCenterRatio).y = 0.0;
          (pIVar39->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
    }
    fVar55 = (pIVar49->IO).MouseWheelH;
    if (((fVar55 == 0.0) && (!NAN(fVar55))) || ((pIVar49->IO).KeyShift == true)) {
      fVar55 = (pIVar49->IO).MouseWheel;
      if (((fVar55 == 0.0) && (!NAN(fVar55))) || ((pIVar49->IO).KeyShift != true))
      goto LAB_001490dc;
    }
    if ((pIVar49->IO).KeyCtrl == false) {
      StartLockWheelingWindow(pIVar39);
      while ((uVar31 = pIVar39->Flags, (uVar31 >> 0x18 & 1) != 0 &&
             (((uVar31 & 0x210) == 0x10 ||
              ((fVar56 = (pIVar39->ScrollMax).x, fVar56 == 0.0 && (!NAN(fVar56)))))))) {
        pIVar39 = pIVar39->ParentWindow;
      }
      if ((uVar31 & 0x210) == 0) {
        fVar56 = (pIVar39->InnerRect).Max.x;
        fVar58 = (pIVar39->InnerRect).Min.x;
        fVar57 = ImGuiWindow::CalcFontSize(pIVar39);
        auVar63 = vminss_avx(ZEXT416((uint)(fVar57 + fVar57)),
                             ZEXT416((uint)((fVar56 - fVar58) * 0.67)));
        auVar81._0_4_ = (int)auVar63._0_4_;
        auVar81._4_4_ = (int)auVar63._4_4_;
        auVar81._8_4_ = (int)auVar63._8_4_;
        auVar81._12_4_ = (int)auVar63._12_4_;
        auVar63 = vcvtdq2ps_avx(auVar81);
        (pIVar39->ScrollTarget).x = (pIVar39->Scroll).x - auVar63._0_4_ * fVar55;
        (pIVar39->ScrollTargetCenterRatio).x = 0.0;
        (pIVar39->ScrollTargetEdgeSnapDist).x = 0.0;
      }
    }
  }
LAB_001490dc:
  pIVar49 = GImGui;
  pIVar39 = GImGui->NavWindow;
  if ((((pIVar39 == (ImGuiWindow *)0x0) || (pIVar39->Active != true)) ||
      ((pIVar39->Flags & 0x40000) != 0)) || ((GImGui->IO).KeyCtrl != false)) {
    bVar27 = false;
  }
  else {
    bVar27 = IsKeyPressedMap(0,true);
  }
  pIVar49->FocusTabPressed = bVar27;
  if ((bVar27 == false) || (pIVar49->ActiveId != 0)) {
    pIVar39 = pIVar49->FocusRequestNextWindow;
  }
  else {
    pIVar39 = pIVar49->NavWindow;
    pIVar49->FocusRequestNextWindow = pIVar39;
    pIVar49->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar49->NavId == 0) || (pIVar49->NavIdTabCounter == 0x7fffffff)) {
      iVar50 = -(uint)(pIVar49->IO).KeyShift;
    }
    else {
      iVar50 = pIVar49->NavIdTabCounter + (-(uint)(pIVar49->IO).KeyShift | 1) + 1;
    }
    pIVar49->FocusRequestNextCounterTabStop = iVar50;
  }
  pIVar49->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar49->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar49->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar39 != (ImGuiWindow *)0x0) {
    pIVar49->FocusRequestCurrWindow = pIVar39;
    if ((pIVar49->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar50 = (pIVar39->DC).FocusCounterRegular, iVar50 != -1)) {
      pIVar49->FocusRequestCurrCounterRegular =
           (pIVar49->FocusRequestNextCounterRegular + iVar50 + 1) % (iVar50 + 1);
    }
    if ((pIVar49->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar50 = (pIVar39->DC).FocusCounterTabStop, iVar50 != -1)) {
      pIVar49->FocusRequestCurrCounterTabStop =
           (pIVar49->FocusRequestNextCounterTabStop + iVar50 + 1) % (iVar50 + 1);
    }
    pIVar49->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar49->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar49->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar49->NavIdTabCounter = 0x7fffffff;
  iVar50 = (pIVar25->WindowsFocusOrder).Size;
  if (iVar50 != (pIVar25->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xf93,"void ImGui::NewFrame()");
  }
  local_68 = 3.4028235e+38;
  if ((pIVar25->GcCompactAll == false) &&
     (fVar55 = (pIVar25->IO).ConfigMemoryCompactTimer, 0.0 <= fVar55)) {
    local_68 = (float)pIVar25->Time - fVar55;
  }
  for (iVar51 = 0; iVar51 != iVar50; iVar51 = iVar51 + 1) {
    ppIVar41 = ImVector<ImGuiWindow_*>::operator[](&pIVar25->Windows,iVar51);
    pIVar39 = *ppIVar41;
    bVar27 = pIVar39->Active;
    pIVar39->WasActive = bVar27;
    pIVar39->BeginCount = 0;
    pIVar39->Active = false;
    pIVar39->WriteAccessed = false;
    if (((bVar27 == false) && (pIVar39->MemoryCompacted == false)) &&
       (pIVar39->LastTimeActive < local_68)) {
      GcCompactTransientWindowBuffers(pIVar39);
    }
    iVar50 = (pIVar25->Windows).Size;
  }
  this_00 = &pIVar25->TablesLastTimeActive;
  for (iVar50 = 0; iVar50 < this_00->Size; iVar50 = iVar50 + 1) {
    pfVar42 = ImVector<float>::operator[](this_00,iVar50);
    if ((0.0 <= *pfVar42) &&
       (pfVar42 = ImVector<float>::operator[](this_00,iVar50), *pfVar42 < local_68)) {
      table = ImVector<ImGuiTable>::operator[](&(pIVar25->Tables).Buf,iVar50);
      TableGcCompactTransientBuffers(table);
    }
  }
  if (pIVar25->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar25->GcCompactAll = false;
  if ((pIVar25->NavWindow != (ImGuiWindow *)0x0) && (pIVar25->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindow_*>::resize(&pIVar25->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&pIVar25->BeginPopupStack,0);
  ImVector<int>::resize(&pIVar25->ItemFlagsStack,0);
  auVar23._12_4_ = 0;
  auVar23._0_12_ = stack0xffffffffffffffbc;
  _local_48 = (ImRect)(auVar23 << 0x20);
  ImVector<int>::push_back(&pIVar25->ItemFlagsStack,(int *)local_48);
  ImVector<ImGuiGroupData>::resize(&pIVar25->GroupStack,0);
  ClosePopupsOverWindow(pIVar25->NavWindow,false);
  pIVar49 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar49->DebugItemPickerActive == true) {
    uVar31 = pIVar49->HoveredIdPreviousFrame;
    pIVar49->MouseCursor = 7;
    bVar27 = IsKeyPressedMap(0xe,true);
    if (bVar27) {
      pIVar49->DebugItemPickerActive = false;
    }
    pIVar26 = GImGui;
    fVar55 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar55 != 0.0) || (NAN(fVar55))) {
      uVar47 = (uint)(uVar31 == 0);
    }
    else if (uVar31 == 0) {
      uVar47 = 1;
    }
    else {
      pIVar49->DebugItemPickerBreakId = uVar31;
      pIVar49->DebugItemPickerActive = false;
      uVar47 = 0;
    }
    pIVar3 = &pIVar26->NextWindowData;
    *(byte *)&pIVar3->Flags = (byte)pIVar3->Flags | 0x40;
    (pIVar26->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar31);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar47 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar49 = GImGui;
  }
  pIVar25->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar49->NextWindowData).Flags = (byte)(pIVar49->NextWindowData).Flags | 2;
  (pIVar49->NextWindowData).SizeVal.x = 400.0;
  (pIVar49->NextWindowData).SizeVal.y = 400.0;
  (pIVar49->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar25->CurrentWindow->IsFallbackWindow != false) {
    CallContextHooks(pIVar25,ImGuiContextHookType_NewFramePost);
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0xfc0,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;
    
    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_Default_);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}